

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O0

string * __thiscall
kratos::EventControl::to_string_abi_cxx11_(string *__return_storage_ptr__,EventControl *this)

{
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_kratos::Var_*)>
  local_40;
  anon_class_1_0_00000001 local_19;
  EventControl *pEStack_18;
  anon_class_1_0_00000001 func;
  EventControl *this_local;
  
  pEStack_18 = this;
  std::function<std::__cxx11::string(kratos::Var_const*)>::
  function<kratos::EventControl::to_string()const::__0&,void>
            ((function<std::__cxx11::string(kratos::Var_const*)> *)&local_40,&local_19);
  to_string(__return_storage_ptr__,this,&local_40);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_kratos::Var_*)>
  ::~function(&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string EventControl::to_string() const {
    auto func = [](const Var *v) { return v->to_string(); };
    return to_string(func);
}